

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O1

VisitReturn __thiscall
QMakeEvaluator::parseJsonInto
          (QMakeEvaluator *this,QByteArray *json,QString *into,ProValueMap *value)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  VisitReturn VVar4;
  ulong uVar5;
  int iVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QAnyStringView QVar8;
  QJsonDocument document;
  QJsonParseError error;
  QArrayData *local_c0;
  int local_b8;
  QChar local_b0;
  QArrayData *local_a8 [3];
  QArrayData *local_90 [3];
  QString local_78;
  undefined1 local_60 [16];
  QStringBuilder<const_QString_&,_QLatin1Char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60._8_4_ = -1;
  local_60._12_4_ = 0;
  local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QJsonDocument::fromJson((QByteArray *)local_60,(QJsonParseError *)json);
  cVar1 = QJsonDocument::isNull();
  if (cVar1 != '\0') {
    if (local_60._12_4_ != 0) {
      if ((int)local_60._8_4_ < 2) {
        iVar6 = 1;
        iVar3 = 1;
      }
      else {
        uVar5 = 0;
        iVar6 = 0;
        uVar2 = 0;
        do {
          cVar1 = (json->d).ptr[uVar5];
          if (cVar1 == '\t') {
            uVar2 = (uVar2 & 0xfffffff8) + 8;
          }
          else if (cVar1 != '\r') {
            if (cVar1 == '\n') {
              iVar6 = iVar6 + 1;
              uVar2 = 0;
            }
            else {
              uVar2 = uVar2 + 1;
            }
          }
          uVar5 = uVar5 + 1;
        } while (local_60._8_4_ - 1 != uVar5);
        iVar6 = iVar6 + 1;
        iVar3 = uVar2 + 1;
      }
      QVar7.m_data = (storage_type *)0x1f;
      QVar7.m_size = (qsizetype)local_a8;
      QString::fromLatin1(QVar7);
      QString::arg_impl((longlong)local_90,(int)local_a8,iVar6,(QChar)0x0);
      QString::arg_impl((longlong)(local_60 + 0x10),(int)local_90,iVar3,(QChar)0x0);
      QJsonParseError::errorString();
      QVar8.m_size = (size_t)(local_60 + 0x10);
      QVar8.field_0.m_data = &local_78;
      QString::arg_impl(QVar8,local_b8,local_b0);
      message(this,0x310,&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_c0 != (QArrayData *)0x0) {
        LOCK();
        (local_c0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c0,2,0x10);
        }
      }
      if ((QArrayData *)local_50.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_50.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_50.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_50.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.a,2,0x10);
        }
      }
      if (local_90[0] != (QArrayData *)0x0) {
        LOCK();
        (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90[0],2,0x10);
        }
      }
      if (local_a8[0] != (QArrayData *)0x0) {
        LOCK();
        (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a8[0],2,0x10);
        }
      }
    }
    VVar4 = ReturnFalse;
    goto LAB_00262b32;
  }
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_50.b.ch = 0x2e;
  local_50.a = into;
  QStringBuilder<const_QString_&,_QLatin1Char>::convertTo<QString>
            (&local_78,(QStringBuilder<const_QString_&,_QLatin1Char> *)(local_60 + 0x10));
  cVar1 = QJsonDocument::isArray();
  if (cVar1 == '\0') {
    cVar1 = QJsonDocument::isObject();
    VVar4 = ReturnFalse;
    if (cVar1 != '\0') {
      QJsonDocument::object();
      addJsonObject((QJsonObject *)(local_60 + 0x10),&local_78,value);
      QJsonObject::~QJsonObject((QJsonObject *)(local_60 + 0x10));
      goto LAB_00262998;
    }
  }
  else {
    QJsonDocument::array();
    addJsonArray((QJsonArray *)(local_60 + 0x10),&local_78,value);
    QJsonArray::~QJsonArray((QJsonArray *)(local_60 + 0x10));
LAB_00262998:
    VVar4 = ReturnTrue;
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00262b32:
  QJsonDocument::~QJsonDocument((QJsonDocument *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::parseJsonInto(const QByteArray &json, const QString &into, ProValueMap *value)
{
    QJsonParseError error;
    QJsonDocument document = QJsonDocument::fromJson(json, &error);
    if (document.isNull()) {
        if (error.error != QJsonParseError::NoError) {
            ErrorPosition errorPos = calculateErrorPosition(json, error.offset);
            evalError(fL1S("Error parsing JSON at %1:%2: %3")
                      .arg(errorPos.line).arg(errorPos.column).arg(error.errorString()));
        }
        return QMakeEvaluator::ReturnFalse;
    }

    QString currentKey = into + QLatin1Char('.');

    // top-level item is either an array or object
    if (document.isArray())
        addJsonArray(document.array(), currentKey, value);
    else if (document.isObject())
        addJsonObject(document.object(), currentKey, value);
    else
        return QMakeEvaluator::ReturnFalse;

    return QMakeEvaluator::ReturnTrue;
}